

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
::
emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<phmap::priv::NonStandardLayout_const&>>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
          *this,int *key,size_t hashval,piecewise_construct_t *args,tuple<const_int_&> *args_1,
          tuple<const_phmap::priv::NonStandardLayout_&> *args_2)

{
  pthread_mutex_t *__mutex;
  string *psVar1;
  NonStandardLayout *pNVar2;
  pointer pcVar3;
  int iVar4;
  size_t sVar5;
  size_t i;
  long lVar6;
  slot_type *psVar7;
  long lVar8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *this_00;
  ctrl_t *pcVar9;
  
  lVar6 = (ulong)(((uint)(hashval >> 0x18) & 0xff ^
                  (uint)hashval >> 8 ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) * 0x70;
  __mutex = (pthread_mutex_t *)(this + lVar6);
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 == 0) {
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
               *)(this + lVar6 + 0x28);
    sVar5 = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
            ::_find_key<int>(this_00,key,hashval);
    if (sVar5 == 0xffffffffffffffff) {
      i = raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
          ::prepare_insert(this_00,hashval);
      lVar6 = *(long *)((long)__mutex + 0x30);
      lVar8 = i * 0x30;
      pNVar2 = (args_2->super__Tuple_impl<0UL,_const_phmap::priv::NonStandardLayout_&>).
               super__Head_base<0UL,_const_phmap::priv::NonStandardLayout_&,_false>._M_head_impl;
      psVar1 = (string *)(lVar6 + 0x10 + lVar8);
      *(int *)(psVar1 + -0x10) =
           *(args_1->super__Tuple_impl<0UL,_const_int_&>).super__Head_base<0UL,_const_int_&,_false>.
            _M_head_impl;
      *(undefined ***)(psVar1 + -8) = &PTR__NonStandardLayout_0034b120;
      lVar6 = lVar6 + 0x20 + lVar8;
      *(long *)(lVar6 + -0x10) = lVar6;
      pcVar3 = (pNVar2->value)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                (psVar1,pcVar3,pcVar3 + (pNVar2->value)._M_string_length);
      raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
      ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
      lVar6 = __mutex[1].__align;
      pcVar9 = (ctrl_t *)(i + lVar6);
      psVar7 = (slot_type *)(lVar8 + *(long *)((long)__mutex + 0x30));
    }
    else {
      lVar6 = __mutex[1].__align;
      pcVar9 = (ctrl_t *)(lVar6 + sVar5);
      psVar7 = (slot_type *)(sVar5 * 0x30 + *(long *)((long)__mutex + 0x30));
    }
    lVar8 = *(long *)((long)__mutex + 0x40);
    (__return_storage_ptr__->first).inner_ = (Inner *)__mutex;
    (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x700);
    (__return_storage_ptr__->first).it_.ctrl_ = pcVar9;
    (__return_storage_ptr__->first).it_.field_1.slot_ = psVar7;
    (__return_storage_ptr__->first).it_end_.ctrl_ = (ctrl_t *)(lVar6 + lVar8);
    __return_storage_ptr__->second = sVar5 == 0xffffffffffffffff;
    pthread_mutex_unlock(__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }